

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

void check_ground_control(CHAR_DATA *ch,CHAR_DATA *victim,float chance,int dam)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CClass *this;
  long lVar5;
  float fVar6;
  float fVar7;
  
  if (dam != 0 && 10.0 <= chance) {
    iVar2 = get_skill(ch,(int)gsn_ground_control);
    iVar3 = number_range(5,0xf);
    sVar1 = ch->level;
    lVar5 = (long)gsn_ground_control;
    this = char_data::Class(ch);
    iVar4 = CClass::GetIndex(this);
    if (*(short *)(lVar5 * 0x60 + 0x4ab788 + (long)iVar4 * 2) <= sVar1) {
      fVar7 = ((float)(iVar2 / 2) + chance) / 3.0 - (float)iVar3;
      fVar6 = 60.0;
      if (fVar7 <= 60.0) {
        fVar6 = fVar7;
      }
      iVar2 = number_percent();
      if ((float)(-(uint)(fVar7 < 5.0) & 0x40a00000 | ~-(uint)(fVar7 < 5.0) & (uint)fVar6) <
          (float)iVar2) {
        check_improve(ch,(int)gsn_ground_control,false,3);
        return;
      }
      act("With brutal skill you grind $N against the ground with your weight.",ch,(void *)0x0,
          victim,3);
      act("$n takes hold of $N and grinds $M against the ground.",ch,(void *)0x0,victim,1);
      act("$n grinds you against the ground with brutal skill.",ch,(void *)0x0,victim,2);
      check_improve(ch,(int)gsn_ground_control,true,2);
      damage_old(ch,victim,dam + -10,(int)gsn_ground_control,1,true);
      LAG_CHAR(victim,0x18);
      return;
    }
  }
  return;
}

Assistant:

void check_ground_control(CHAR_DATA *ch, CHAR_DATA *victim, float chance, int dam)
{
	if (chance < 10)
		return;

	if (dam == 0)
		return;

	chance += get_skill(ch, gsn_ground_control) / 2;
	chance /= 3;

	chance -= number_range(5, 15);
	chance = URANGE(5, chance, 60);

	if (ch->level < skill_table[gsn_ground_control].skill_level[ch->Class()->GetIndex()])
		return;

	if (number_percent() > chance)
	{
		check_improve(ch, gsn_ground_control, false, 3);
		return;
	}

	act("With brutal skill you grind $N against the ground with your weight.", ch, 0, victim, TO_CHAR);
	act("$n takes hold of $N and grinds $M against the ground.", ch, 0, victim, TO_NOTVICT);
	act("$n grinds you against the ground with brutal skill.", ch, 0, victim, TO_VICT);

	dam -= 10;

	check_improve(ch, gsn_ground_control, true, 2);
	damage_old(ch, victim, dam, gsn_ground_control, DAM_BASH, true);
	LAG_CHAR(victim, 2 * PULSE_VIOLENCE);
}